

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

bool * __thiscall google::protobuf::RepeatedField<bool>::Get(RepeatedField<bool> *this,int index)

{
  LogMessage *pLVar1;
  bool *pbVar2;
  LogFinisher local_91;
  LogMessage local_90;
  LogMessage local_58;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x27f);
    pLVar1 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar1 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_91,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  pbVar2 = elements(this);
  return pbVar2 + index;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return elements()[index];
}